

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_intervals.h
# Opt level: O0

void __thiscall
Gudhi::Persistence_representations::Persistence_intervals::Persistence_intervals
          (Persistence_intervals *this,char *filename,uint dimension)

{
  uint uVar1;
  char *__s;
  uint uVar2;
  allocator<char> local_a9;
  string local_a8;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> local_88;
  allocator<char> local_59;
  string local_58;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> local_38;
  uint local_1c;
  char *pcStack_18;
  uint dimension_local;
  char *filename_local;
  Persistence_intervals *this_local;
  
  local_1c = dimension;
  pcStack_18 = filename;
  filename_local = (char *)this;
  std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::vector
            (&this->intervals);
  uVar1 = local_1c;
  uVar2 = std::numeric_limits<unsigned_int>::max();
  __s = pcStack_18;
  if (uVar1 == uVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,__s,&local_59);
    read_persistence_intervals_in_one_dimension_from_file(&local_38,&local_58,-1,-1.0);
    std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::operator=
              (&this->intervals,&local_38);
    std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::~vector
              (&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator(&local_59);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,__s,&local_a9);
    read_persistence_intervals_in_one_dimension_from_file(&local_88,&local_a8,local_1c,-1.0);
    std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::operator=
              (&this->intervals,&local_88);
    std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::~vector
              (&local_88);
    std::__cxx11::string::~string((string *)&local_a8);
    std::allocator<char>::~allocator(&local_a9);
  }
  set_up_numbers_of_functions_for_vectorization_and_projections_to_reals(this);
  return;
}

Assistant:

Persistence_intervals::Persistence_intervals(const char* filename, unsigned dimension) {
  if (dimension == std::numeric_limits<unsigned>::max()) {
    this->intervals = read_persistence_intervals_in_one_dimension_from_file(filename);
  } else {
    this->intervals = read_persistence_intervals_in_one_dimension_from_file(filename, dimension);
  }
  this->set_up_numbers_of_functions_for_vectorization_and_projections_to_reals();
}